

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ByteSequence output;
  ByteSequence result;
  uint8_t in [19];
  uchar local_45 [5];
  ByteSequence input;
  uint8_t out [20];
  
  in[0] = '\0';
  in[1] = '\0';
  in[2] = '\0';
  in[3] = '\n';
  in[4] = '\x14';
  in[5] = '\0';
  in[6] = '(';
  in[7] = '\0';
  in[8] = '<';
  in[9] = 'F';
  in[10] = 'P';
  in[0xb] = 'Z';
  in[0xc] = 'd';
  in[0xd] = 'n';
  in[0xe] = '\0';
  in[0xf] = 0x82;
  in[0x10] = '\0';
  in[0x11] = 0x96;
  in[0x12] = 0xa0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&input,in,local_45,
             (allocator_type *)&output);
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cobs::cobs_encode(&result,&input);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&output,&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  cobs::cobs_decode(&result,&output);
  cobs_encode(in,0x13,out);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{


  int rc= 0;
  const int DATASIZE = 19;

  uint8_t in[] = {0,0,0,10,20,0,40,0,60,70,80,90,100,110,0,130,0,150,160};
  uint8_t out[DATASIZE + 1 + DATASIZE / 254];

  
  cobs::ByteSequence input( in, in+DATASIZE);
  cobs::ByteSequence output;

  output =	cobs::cobs_encode(input);
  cobs::ByteSequence result = cobs::cobs_decode(output);

 size_t written =  cobs_encode(in, DATASIZE, out);
  
  return(rc);


}